

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<const_solitaire::interfaces::Solitaire_&()>::Invoke
          (FunctionMocker<const_solitaire::interfaces::Solitaire_&()> *this)

{
  Solitaire *pSVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<const_solitaire::interfaces::Solitaire_&> *pAVar2;
  ArgumentTuple tuple;
  undefined1 local_9;
  
  local_9 = 0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_9);
  pAVar2 = DownCast_<testing::internal::ActionResultHolder<solitaire::interfaces::Solitaire_const&>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  pSVar1 = (pAVar2->result_).value_ptr_;
  (*(pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar2);
  return pSVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }